

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_fare_attributes_db(feed_db_t *db,fare_attributes_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  fare_attributes_t *pfVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  sqlite3_stmt *stmt;
  fare_attributes_t record;
  char qr [117];
  sqlite3_stmt *local_150;
  fare_attributes_t local_148;
  char local_a8 [112];
  undefined4 local_38;
  undefined1 local_34;
  
  bVar9 = 0;
  uVar2 = count_rows_db(db,"fare_attributes");
  if (0 < (int)uVar2) {
    pcVar7 = 
    "SELECT fare_id, price, currency_type, payment_method,transfers, agency_id, transfer_duration FROM `fare_attributes`;"
    ;
    pcVar8 = local_a8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
      pcVar8 = pcVar8 + (ulong)bVar9 * -0x10 + 8;
    }
    local_34 = 0;
    local_38 = 0x3b607365;
    sqlite3_prepare_v2(db->conn,local_a8,-1,&local_150,(char **)0x0);
    pfVar4 = (fare_attributes_t *)malloc((ulong)uVar2 * 0xa0);
    *records = pfVar4;
    uVar1 = 0xffffffff;
    if (pfVar4 != (fare_attributes_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_150);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_fare_attributes(&local_148);
        puVar5 = sqlite3_column_text(local_150,0);
        strcpy(local_148.fare_id,(char *)puVar5);
        local_148.price = sqlite3_column_double(local_150,1);
        puVar5 = sqlite3_column_text(local_150,2);
        strcpy(local_148.currency_type,(char *)puVar5);
        local_148.payment_method = sqlite3_column_int(local_150,3);
        local_148.transfers = sqlite3_column_int(local_150,4);
        puVar5 = sqlite3_column_text(local_150,5);
        strcpy(local_148.agency_id,(char *)puVar5);
        local_148.transfer_duration = sqlite3_column_double(local_150,6);
        memcpy((*records)->fare_id + lVar6,&local_148,0xa0);
        lVar6 = lVar6 + 0xa0;
      } while ((ulong)uVar2 * 0xa0 != lVar6);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_150);
  }
  return uVar2;
}

Assistant:

int fetch_all_fare_attributes_db(feed_db_t *db, fare_attributes_t **records) {

    fare_attributes_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "fare_attributes");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "fare_id, price, currency_type, payment_method,"
                    "transfers, agency_id, transfer_duration "
                "FROM `fare_attributes`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_fare_attributes(&record);

        strcpy(record.fare_id, sqlite3_column_text(stmt, 0));
        record.price = sqlite3_column_double(stmt, 1);
        strcpy(record.currency_type, sqlite3_column_text(stmt, 2));
        record.payment_method = (payment_method_t)sqlite3_column_int(stmt, 3);
        record.transfers = (transfers_state_t)sqlite3_column_int(stmt, 4);
        strcpy(record.agency_id, sqlite3_column_text(stmt, 5));
        record.transfer_duration = sqlite3_column_double(stmt, 6);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}